

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker stroker,PVG_FT_Outline *outline)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  PVG_FT_Error PVar4;
  PVG_FT_Vector *pPVar5;
  byte *pbVar6;
  undefined1 local_e0 [8];
  PVG_FT_Vector vec_2;
  PVG_FT_Vector vec2;
  PVG_FT_Vector vec1;
  PVG_FT_Vector v_middle;
  PVG_FT_Vector vec_1;
  PVG_FT_Vector vec;
  PVG_FT_UInt last;
  PVG_FT_Int tag;
  PVG_FT_UInt first;
  PVG_FT_Int n;
  PVG_FT_Error error;
  char *tags;
  PVG_FT_Vector *limit;
  PVG_FT_Vector *point;
  PVG_FT_Vector v_start;
  PVG_FT_Vector v_control;
  PVG_FT_Vector v_last;
  PVG_FT_Outline *outline_local;
  PVG_FT_Stroker stroker_local;
  
  if ((outline == (PVG_FT_Outline *)0x0) || (stroker == (PVG_FT_Stroker)0x0)) {
    stroker_local._4_4_ = -1;
  }
  else {
    PVG_FT_Stroker_Rewind(stroker);
    last = 0;
    for (tag = 0; tag < outline->n_contours; tag = tag + 1) {
      uVar1 = outline->contours[tag];
      tags = (char *)(outline->points + uVar1);
      if (last < uVar1) {
        v_start.y = outline->points[last].x;
        lVar2 = outline->points[last].y;
        point = (PVG_FT_Vector *)outline->points[uVar1].x;
        v_start.x = outline->points[uVar1].y;
        limit = outline->points + last;
        _n = (byte *)(outline->tags + last);
        if ((*_n & 3) == 2) {
          return -2;
        }
        pPVar5 = (PVG_FT_Vector *)v_start.y;
        if ((*_n & 3) == 0) {
          if ((outline->tags[uVar1] & 3U) == 1) {
            tags = (char *)((long)tags + -0x10);
          }
          else {
            point = (PVG_FT_Vector *)
                    (((long)&point->x + (long)&((PVG_FT_Vector *)v_start.y)->x) / 2);
            v_start.x = (lVar2 + v_start.x) / 2;
          }
          limit = limit + -1;
          _n = _n + -1;
          pPVar5 = point;
          lVar2 = v_start.x;
        }
        v_start.x = lVar2;
        point = pPVar5;
        iVar3 = PVG_FT_Stroker_BeginSubPath
                          (stroker,(PVG_FT_Vector *)&point,outline->contours_flag[tag]);
        pbVar6 = _n;
        while( true ) {
          while( true ) {
            while( true ) {
              if (iVar3 != 0) {
                return iVar3;
              }
              first = 0;
              if (tags <= limit) goto LAB_00135c2c;
              pPVar5 = limit + 1;
              _n = pbVar6 + 1;
              if ((*_n & 3) != 0) break;
              v_start.y = pPVar5->x;
              v_control.x = limit[1].y;
              limit = pPVar5;
              while( true ) {
                if (tags <= limit) {
                  first = PVG_FT_Stroker_ConicTo
                                    (stroker,(PVG_FT_Vector *)&v_start.y,(PVG_FT_Vector *)&point);
                  goto LAB_00135c2c;
                }
                pPVar5 = limit + 1;
                _n = _n + 1;
                v_middle.y = pPVar5->x;
                vec_1.x = limit[1].y;
                limit = pPVar5;
                if ((*_n & 3) == 1) break;
                if ((*_n & 3) != 0) {
                  return -2;
                }
                vec1.y = (v_start.y + v_middle.y) / 2;
                v_middle.x = (v_control.x + vec_1.x) / 2;
                PVar4 = PVG_FT_Stroker_ConicTo
                                  (stroker,(PVG_FT_Vector *)&v_start.y,(PVG_FT_Vector *)&vec1.y);
                if (PVar4 != 0) {
                  return PVar4;
                }
                v_start.y = v_middle.y;
                v_control.x = vec_1.x;
              }
              iVar3 = PVG_FT_Stroker_ConicTo
                                (stroker,(PVG_FT_Vector *)&v_start.y,(PVG_FT_Vector *)&v_middle.y);
              pbVar6 = _n;
            }
            if ((*_n & 3) != 1) break;
            vec_1.y = pPVar5->x;
            iVar3 = PVG_FT_Stroker_LineTo(stroker,(PVG_FT_Vector *)&vec_1.y);
            pbVar6 = _n;
            limit = pPVar5;
          }
          if (tags < limit + 2) {
            return -2;
          }
          if ((pbVar6[2] & 3) != 2) {
            return -2;
          }
          pPVar5 = limit + 3;
          pbVar6 = pbVar6 + 3;
          vec2.y = limit[1].x;
          vec1.x = limit[1].y;
          vec_2.y = limit[2].x;
          vec2.x = limit[2].y;
          if (tags < pPVar5) break;
          local_e0 = (undefined1  [8])pPVar5->x;
          vec_2.x = limit[3].y;
          iVar3 = PVG_FT_Stroker_CubicTo
                            (stroker,(PVG_FT_Vector *)&vec2.y,(PVG_FT_Vector *)&vec_2.y,
                             (PVG_FT_Vector *)local_e0);
          limit = pPVar5;
        }
        first = PVG_FT_Stroker_CubicTo
                          (stroker,(PVG_FT_Vector *)&vec2.y,(PVG_FT_Vector *)&vec_2.y,
                           (PVG_FT_Vector *)&point);
LAB_00135c2c:
        if (first != 0) {
          return first;
        }
        if (stroker->first_point != '\0') {
          stroker->subpath_open = '\x01';
          PVar4 = ft_stroker_subpath_start(stroker,0,0);
          if (PVar4 != 0) {
            return PVar4;
          }
        }
        PVar4 = PVG_FT_Stroker_EndSubPath(stroker);
        if (PVar4 != 0) {
          return PVar4;
        }
      }
      last = uVar1 + 1;
    }
    stroker_local._4_4_ = 0;
  }
  return stroker_local._4_4_;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker        stroker,
                                       const PVG_FT_Outline* outline)
{
    PVG_FT_Vector v_last;
    PVG_FT_Vector v_control;
    PVG_FT_Vector v_start;

    PVG_FT_Vector* point;
    PVG_FT_Vector* limit;
    char*         tags;

    PVG_FT_Error error;

    PVG_FT_Int  n;     /* index of contour in outline     */
    PVG_FT_UInt first; /* index of first point in contour */
    PVG_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // PVG_FT_THROW( Invalid_Argument );

    PVG_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        PVG_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = PVG_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == PVG_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == PVG_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (PVG_FT_CURVE_TAG(outline->tags[last]) == PVG_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = PVG_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = PVG_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case PVG_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                PVG_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = PVG_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case PVG_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    PVG_FT_Vector vec;
                    PVG_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = PVG_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == PVG_FT_CURVE_TAG_ON) {
                        error =
                            PVG_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != PVG_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* PVG_FT_CURVE_TAG_CUBIC */
            {
                PVG_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    PVG_FT_CURVE_TAG(tags[1]) != PVG_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    PVG_FT_Vector vec;

                    vec = point[0];

                    error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        if (stroker->first_point) {
            stroker->subpath_open = TRUE;
            error = ft_stroker_subpath_start(stroker, 0, 0);
            if (error) goto Exit;
        }

        error = PVG_FT_Stroker_EndSubPath(stroker);
        if (error) goto Exit;

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // PVG_FT_THROW( Invalid_Outline );
}